

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

void __thiscall QStatusBarPrivate::tryToShowSizeGrip(QStatusBarPrivate *this)

{
  QWidget *this_00;
  
  if (this->showSizeGrip == true) {
    this->showSizeGrip = false;
    this_00 = &this->resizer->super_QWidget;
    if ((this_00 != (QWidget *)0x0) && ((this_00->data->widget_attributes & 0x8000) == 0)) {
      QWidget::setAttribute(this_00,WA_WState_ExplicitShowHide,false);
      QMetaObject::invokeMethod<>((QObject *)this->resizer,"_q_showIfNotHidden",DirectConnection);
      QWidget::setAttribute(&this->resizer->super_QWidget,WA_WState_ExplicitShowHide,false);
      return;
    }
  }
  return;
}

Assistant:

void tryToShowSizeGrip()
    {
        if (!showSizeGrip)
            return;
        showSizeGrip = false;
        if (!resizer || resizer->isVisible())
            return;
        resizer->setAttribute(Qt::WA_WState_ExplicitShowHide, false);
        QMetaObject::invokeMethod(resizer, "_q_showIfNotHidden", Qt::DirectConnection);
        resizer->setAttribute(Qt::WA_WState_ExplicitShowHide, false);
    }